

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O3

bool dxil_spv::emit_wave_active_bit_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  Id IVar2;
  Id IVar3;
  uint uVar4;
  Id type_id;
  Builder *this;
  Operation *this_00;
  Value *pVVar5;
  Builder *this_01;
  Builder *this_02;
  Type *pTVar6;
  Operation *this_03;
  Op op;
  uint32_t op_kind;
  uint local_44;
  Operation *local_40;
  Capability local_34;
  
  this = Converter::Impl::builder(impl);
  bVar1 = get_constant_operand(&instruction->super_Instruction,2,&local_44);
  if (!bVar1) {
    return bVar1;
  }
  op = (local_44 & 0xff) + OpGroupNonUniformBitwiseAnd;
  if (2 < (byte)local_44) {
    op = OpNop;
  }
  this_00 = Converter::Impl::allocate(impl,op,(Value *)instruction);
  IVar2 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar2 = spv::Builder::makeIntConstant(this,IVar2,3,false);
  Operation::add_id(this_00,IVar2);
  Operation::add_literal(this_00,0);
  pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  IVar2 = Converter::Impl::get_id_for_value(impl,pVVar5,0);
  if (((impl->execution_model != ExecutionModelFragment) ||
      ((impl->options).strict_helper_lane_waveops != true)) ||
     (((impl->execution_mode_meta).waveops_include_helper_lanes & 1U) != 0)) goto LAB_0016b00f;
  this_01 = Converter::Impl::builder(impl);
  this_02 = Converter::Impl::builder(impl);
  IVar3 = spv::Builder::makeBoolType(this_02);
  local_40 = Converter::Impl::allocate(impl,OpIsHelperInvocationEXT,IVar3);
  Converter::Impl::add(impl,local_40,false);
  pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  pTVar6 = LLVMBC::Value::getType(pVVar5);
  uVar4 = LLVMBC::Type::getIntegerBitWidth(pTVar6);
  if (uVar4 == 0x40) {
    IVar3 = spv::Builder::makeIntegerType(this_01,0x40,false);
    IVar3 = spv::Builder::makeInt64Constant(this_01,IVar3,-(ulong)((byte)local_44 == 0),false);
  }
  else {
    if (uVar4 == 0x20) {
      IVar3 = spv::Builder::makeIntegerType(this_01,0x20,false);
      uVar4 = -(uint)((byte)local_44 == 0);
    }
    else {
      IVar3 = 0;
      if (uVar4 != 0x10) goto LAB_0016afa0;
      IVar3 = spv::Builder::makeIntegerType(this_01,0x10,false);
      uVar4 = 0xffff;
      if ((byte)local_44 != 0) {
        uVar4 = 0;
      }
    }
    IVar3 = spv::Builder::makeIntConstant(this_01,IVar3,uVar4,false);
  }
LAB_0016afa0:
  pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  pTVar6 = LLVMBC::Value::getType(pVVar5);
  type_id = Converter::Impl::get_type_id(impl,pTVar6,0);
  this_03 = Converter::Impl::allocate(impl,OpSelect,type_id);
  Operation::add_id(this_03,local_40->id);
  Operation::add_id(this_03,IVar3);
  Operation::add_id(this_03,IVar2);
  Converter::Impl::add(impl,this_03,false);
  IVar2 = this_03->id;
LAB_0016b00f:
  Operation::add_id(this_00,IVar2);
  Converter::Impl::add(impl,this_00,false);
  local_34 = CapabilityGroupNonUniformArithmetic;
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)&this->capabilities,&local_34);
  return bVar1;
}

Assistant:

bool emit_wave_active_bit_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	spv::Op opcode = spv::OpNop;

	uint32_t op_kind;
	if (!get_constant_operand(instruction, 2, &op_kind))
		return false;

	switch (static_cast<DXIL::WaveBitOpKind>(op_kind))
	{
	case DXIL::WaveBitOpKind::And:
		opcode = spv::OpGroupNonUniformBitwiseAnd;
		break;

	case DXIL::WaveBitOpKind::Or:
		opcode = spv::OpGroupNonUniformBitwiseOr;
		break;

	case DXIL::WaveBitOpKind::Xor:
		opcode = spv::OpGroupNonUniformBitwiseXor;
		break;
	}

	auto *op = impl.allocate(opcode, instruction);
	op->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
	op->add_literal(spv::GroupOperationReduce);

	spv::Id input_value = impl.get_id_for_value(instruction->getOperand(1));
	if (wave_op_needs_helper_lane_masking(impl))
		input_value = build_mask_reduction_input_bitwise(impl, instruction, input_value, DXIL::WaveBitOpKind(op_kind));

	op->add_id(input_value);

	impl.add(op);

	builder.addCapability(spv::CapabilityGroupNonUniformArithmetic);
	return true;
}